

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O3

void __thiscall
CMU462::DynamicScene::Skeleton::setSelection(Skeleton *this,int pickID,Selection *selection)

{
  _Rb_tree_header *p_Var1;
  mapped_type *ppJVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int local_c;
  
  p_Var3 = (this->idToJoint)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->idToJoint)._M_t._M_impl.super__Rb_tree_header;
    p_Var4 = &p_Var1->_M_header;
    do {
      if (pickID <= (int)p_Var3[1]._M_color) {
        p_Var4 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < pickID];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && ((int)p_Var4[1]._M_color <= pickID)) {
      (selection->coordinates).x = 0.0;
      (selection->coordinates).y = 0.0;
      selection->object = (SceneObject *)0x0;
      selection->element = (HalfedgeElement *)0x0;
      (selection->coordinates).z = 0.0;
      selection->axis = None;
      local_c = pickID;
      ppJVar2 = std::
                map<int,_CMU462::DynamicScene::Joint_*,_std::less<int>,_std::allocator<std::pair<const_int,_CMU462::DynamicScene::Joint_*>_>_>
                ::operator[](&this->idToJoint,&local_c);
      selection->object = &(*ppJVar2)->super_SceneObject;
    }
  }
  return;
}

Assistant:

void Skeleton::setSelection(int pickID, Selection& selection)
  {
    // Set the selection to the joint specified by the given picking ID;
    // these values were generated in Skeleton::draw_pick.
    if (idToJoint.find(pickID) != idToJoint.end())
    {
      selection.clear();
      selection.object = idToJoint[pickID];
    }
  }